

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_tec_fill(REF_ADJ ref_adj,char *filename)

{
  FILE *__s;
  REF_STATUS RVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0xf7,
           "ref_adj_tec_fill","unable to open file");
    RVar1 = 2;
  }
  else {
    fwrite("title=\"tecplot refine adj fill\"\n",0x20,1,__s);
    fwrite("variables = \"item\" \"node\"\n",0x1a,1,__s);
    if ((long)ref_adj->nnode < 1) {
      uVar4 = 0;
    }
    else {
      lVar2 = 0;
      uVar4 = 0;
      do {
        iVar3 = ref_adj->first[lVar2];
        if (iVar3 != -1) {
          do {
            uVar4 = (ulong)((int)uVar4 + 1);
            iVar3 = ref_adj->item[iVar3].next;
          } while (iVar3 != -1);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != ref_adj->nnode);
    }
    RVar1 = 0;
    fprintf(__s,"zone t=\"fill\", i=%d, datapacking=%s\n",uVar4,"point");
    if (0 < ref_adj->nnode) {
      uVar4 = 0;
      do {
        for (uVar5 = ref_adj->first[uVar4]; uVar5 != 0xffffffff;
            uVar5 = ref_adj->item[(int)uVar5].next) {
          fprintf(__s," %d %d\n",(ulong)uVar5,uVar4 & 0xffffffff);
        }
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)ref_adj->nnode);
    }
    fclose(__s);
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_adj_tec_fill(REF_ADJ ref_adj, const char *filename) {
  REF_INT node, item, nadj;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine adj fill\"\n");
  fprintf(file, "variables = \"item\" \"node\"\n");

  nadj = 0;
  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    each_ref_adj_node_item(ref_adj, node, item) { nadj++; }
  }

  fprintf(file, "zone t=\"fill\", i=%d, datapacking=%s\n", nadj, "point");

  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    each_ref_adj_node_item(ref_adj, node, item) {
      fprintf(file, " %d %d\n", item, node);
    }
  }

  fclose(file);

  return REF_SUCCESS;
}